

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<int>::resize(QList<int> *this,qsizetype size)

{
  int *piVar1;
  Data *pDVar2;
  int *piVar3;
  long lVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) <
      size)) {
    QArrayDataPointer<int>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(int **)0x0,(QArrayDataPointer<int> *)0x0);
    lVar4 = (this->d).size;
  }
  else {
    lVar4 = (this->d).size;
    if (size < lVar4) goto LAB_001047f0;
  }
  if (size <= lVar4) {
    return;
  }
  piVar3 = (this->d).ptr;
  piVar1 = piVar3 + lVar4;
  *piVar1 = 0;
  if (piVar1 + 1 != piVar3 + size) {
    memset(piVar1 + 1,0,(size * 4 + lVar4 * -4) - 4);
  }
LAB_001047f0:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }